

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O2

void __thiscall
CVmObjPattern::restore_from_file
          (CVmObjPattern *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  char buf [5];
  
  if ((this->super_CVmObject).ext_ == (char *)0x0) {
    iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x18,this);
    (this->super_CVmObject).ext_ = (char *)CONCAT44(extraout_var,iVar2);
  }
  CVmFile::read_bytes(fp,buf,5);
  CVmObjFixup::fix_dh(fixups,buf);
  vmb_get_dh(buf,(vm_val_t *)((this->super_CVmObject).ext_ + 8));
  pcVar1 = (this->super_CVmObject).ext_;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  CVmObjTable::request_post_load_init(&G_obj_table_X,self);
  return;
}

Assistant:

void CVmObjPattern::restore_from_file(VMG_ vm_obj_id_t self,
                                      class CVmFile *fp, CVmObjFixup *fixups)
{
    /* if we don't already have an extension, allocate one */
    if (ext_ == 0)
        ext_ = (char *)G_mem->get_var_heap()
               ->alloc_mem(sizeof(vmobj_pat_ext), this);

    /* read the source string reference */
    char buf[VMB_DATAHOLDER];
    fp->read_bytes(buf, VMB_DATAHOLDER);

    /* fix it up */
    fixups->fix_dh(vmg_ buf);

    /* remember it in our extension */
    vmb_get_dh(buf, &get_ext()->str);

    /* 
     *   clear out our pattern and request post-load initialization - we
     *   can't necessarily compile it yet, because we might not have loaded
     *   the source string data, so just make a note that we need to compile
     *   it the next time we need it 
     */
    set_pattern(0);
    G_obj_table->request_post_load_init(self);
}